

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.h
# Opt level: O3

void read_nal_unit_header_svc_extension(nal_svc_ext_t *nal_svc_ext,bs_t *b)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  uint32_t r;
  uint uVar5;
  uint uVar6;
  _Bool _Var7;
  bool bVar8;
  
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar2 = b->p;
  pbVar1 = b->end;
  if (pbVar2 < pbVar1) {
    _Var7 = (*pbVar2 >> (uVar4 & 0x1f) & 1) != 0;
  }
  else {
    _Var7 = false;
  }
  if (uVar4 == 0) {
    pbVar2 = pbVar2 + 1;
    b->p = pbVar2;
    uVar4 = 8;
  }
  nal_svc_ext->idr_flag = _Var7;
  uVar5 = 0;
  iVar3 = 5;
  do {
    uVar4 = uVar4 - 1;
    b->bits_left = uVar4;
    uVar6 = 0;
    if (pbVar2 < pbVar1) {
      uVar6 = (uint)((*pbVar2 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar4 = 8;
    }
    uVar5 = uVar5 | uVar6 << ((byte)iVar3 & 0x1f);
    bVar8 = iVar3 != 0;
    iVar3 = iVar3 + -1;
  } while (bVar8);
  nal_svc_ext->priority_id = (uchar)uVar5;
  uVar4 = uVar4 - 1;
  b->bits_left = uVar4;
  if (pbVar2 < pbVar1) {
    _Var7 = (*pbVar2 >> (uVar4 & 0x1f) & 1) != 0;
  }
  else {
    _Var7 = false;
  }
  if (uVar4 == 0) {
    pbVar2 = pbVar2 + 1;
    b->p = pbVar2;
    uVar4 = 8;
  }
  nal_svc_ext->no_inter_layer_pred_flag = _Var7;
  uVar5 = 0;
  iVar3 = 2;
  do {
    uVar4 = uVar4 - 1;
    b->bits_left = uVar4;
    uVar6 = 0;
    if (pbVar2 < pbVar1) {
      uVar6 = (uint)((*pbVar2 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar4 = 8;
    }
    uVar5 = uVar5 | uVar6 << ((byte)iVar3 & 0x1f);
    bVar8 = iVar3 != 0;
    iVar3 = iVar3 + -1;
  } while (bVar8);
  nal_svc_ext->dependency_id = (uchar)uVar5;
  uVar5 = 0;
  iVar3 = 3;
  do {
    uVar4 = uVar4 - 1;
    b->bits_left = uVar4;
    uVar6 = 0;
    if (pbVar2 < pbVar1) {
      uVar6 = (uint)((*pbVar2 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar4 = 8;
    }
    uVar5 = uVar5 | uVar6 << ((byte)iVar3 & 0x1f);
    bVar8 = iVar3 != 0;
    iVar3 = iVar3 + -1;
  } while (bVar8);
  nal_svc_ext->quality_id = (uchar)uVar5;
  uVar5 = 0;
  iVar3 = 2;
  do {
    uVar4 = uVar4 - 1;
    b->bits_left = uVar4;
    uVar6 = 0;
    if (pbVar2 < pbVar1) {
      uVar6 = (uint)((*pbVar2 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar4 = 8;
    }
    uVar5 = uVar5 | uVar6 << ((byte)iVar3 & 0x1f);
    bVar8 = iVar3 != 0;
    iVar3 = iVar3 + -1;
  } while (bVar8);
  nal_svc_ext->temporal_id = (uchar)uVar5;
  uVar4 = uVar4 - 1;
  b->bits_left = uVar4;
  if (pbVar2 < pbVar1) {
    _Var7 = (*pbVar2 >> (uVar4 & 0x1f) & 1) != 0;
  }
  else {
    _Var7 = false;
  }
  if (uVar4 == 0) {
    pbVar2 = pbVar2 + 1;
    b->p = pbVar2;
    uVar4 = 8;
  }
  nal_svc_ext->use_ref_base_pic_flag = _Var7;
  uVar4 = uVar4 - 1;
  b->bits_left = uVar4;
  if (pbVar2 < pbVar1) {
    _Var7 = (*pbVar2 >> (uVar4 & 0x1f) & 1) != 0;
  }
  else {
    _Var7 = false;
  }
  if (uVar4 == 0) {
    pbVar2 = pbVar2 + 1;
    b->p = pbVar2;
    uVar4 = 8;
  }
  nal_svc_ext->discardable_flag = _Var7;
  uVar4 = uVar4 - 1;
  b->bits_left = uVar4;
  if (pbVar2 < pbVar1) {
    _Var7 = (*pbVar2 >> (uVar4 & 0x1f) & 1) != 0;
  }
  else {
    _Var7 = false;
  }
  if (uVar4 == 0) {
    pbVar2 = pbVar2 + 1;
    b->p = pbVar2;
    uVar4 = 8;
  }
  nal_svc_ext->output_flag = _Var7;
  uVar5 = 0;
  iVar3 = 1;
  do {
    uVar4 = uVar4 - 1;
    b->bits_left = uVar4;
    uVar6 = 0;
    if (pbVar2 < pbVar1) {
      uVar6 = (uint)((*pbVar2 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar4 = 8;
    }
    uVar5 = uVar5 | uVar6 << ((byte)iVar3 & 0x1f);
    bVar8 = iVar3 != 0;
    iVar3 = iVar3 + -1;
  } while (bVar8);
  nal_svc_ext->reserved_three_2bits = (uchar)uVar5;
  return;
}

Assistant:

static inline uint32_t bs_read_u1(bs_t* b)
{
    uint32_t r = 0;
    
    b->bits_left--;

    if (! bs_eof(b))
    {
        r = ((*(b->p)) >> b->bits_left) & 0x01;
    }

    if (b->bits_left == 0) { b->p ++; b->bits_left = 8; }

    return r;
}